

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

void __thiscall
Omega_h::InputYamlReader::handle_block_scalar
          (InputYamlReader *this,size_t parent_indent_level,string *header,
          string *leading_empties_or_comments,string *rest,string *content,string *comment)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  char *pcVar6;
  ulong uVar7;
  istream *piVar8;
  long lVar9;
  ParserFail *this_00;
  ulong uVar10;
  unsigned_long *puVar11;
  string local_400 [32];
  Omega_h local_3e0 [32];
  string local_3c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380 [32];
  string *local_360;
  ulong local_358;
  size_t end_cut;
  size_t start_cut;
  size_t next_newline;
  size_t unindent_pos;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  undefined8 local_328;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  undefined8 local_310;
  ulong local_308;
  size_type ispace;
  size_t num_spaces;
  size_type last_newline;
  __cxx11 local_2d0 [32];
  __cxx11 local_2b0 [39];
  allocator local_289;
  string local_288 [8];
  string msg;
  string *local_268;
  size_t num_indent_spaces;
  size_t newline_before_content;
  size_t content_beg;
  long local_230;
  size_t keep_beg;
  string newline;
  size_t first_newline;
  string local_1f0 [32];
  stringstream local_1d0 [8];
  stringstream ss;
  string *local_48;
  size_t indentation_indicator;
  char chomping_indicator;
  string *psStack_38;
  char style;
  string *content_local;
  string *rest_local;
  string *leading_empties_or_comments_local;
  string *header_local;
  size_t parent_indent_level_local;
  InputYamlReader *this_local;
  
  local_48 = (string *)0x0;
  psStack_38 = content;
  content_local = rest;
  rest_local = leading_empties_or_comments;
  leading_empties_or_comments_local = header;
  header_local = (string *)parent_indent_level;
  parent_indent_level_local = (size_t)this;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)header);
  indentation_indicator._7_1_ = *pcVar6;
  std::__cxx11::string::substr((ulong)local_1f0,(ulong)leading_empties_or_comments_local);
  _Var5 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1d0,local_1f0,_Var5);
  std::__cxx11::string::~string(local_1f0);
  uVar7 = std::__cxx11::string::size();
  if (1 < uVar7) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)leading_empties_or_comments_local);
    bVar3 = my_isdigit(*pcVar6);
    if (bVar3) {
      std::istream::operator>>(local_1d0,(ulong *)&local_48);
      local_48 = header_local + (long)local_48;
    }
  }
  piVar8 = std::operator>>((istream *)local_1d0,(char *)((long)&indentation_indicator + 6));
  bVar4 = std::ios::operator!(piVar8 + *(long *)(*(long *)piVar8 + -0x18));
  if ((bVar4 & 1) != 0) {
    indentation_indicator._6_1_ = '\0';
  }
  lVar9 = std::__cxx11::string::find_first_of((char *)rest_local,0x732981);
  std::__cxx11::string::string((string *)&keep_beg);
  if ((lVar9 == 0) ||
     (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)rest_local), *pcVar6 != '\r')) {
    std::__cxx11::string::operator=((string *)&keep_beg,"\n");
  }
  else {
    std::__cxx11::string::operator=((string *)&keep_beg,"\r\n");
  }
  local_230 = std::__cxx11::string::size();
  local_230 = (lVar9 + 1) - local_230;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)rest_local);
  if (*pcVar6 == '#') {
    std::__cxx11::string::substr((ulong)&content_beg,(ulong)rest_local);
    std::__cxx11::string::operator=((string *)comment,(string *)&content_beg);
    std::__cxx11::string::~string((string *)&content_beg);
  }
  newline_before_content = std::__cxx11::string::find_first_not_of((char *)rest_local,0x732984);
  if (newline_before_content == 0xffffffffffffffff) {
    newline_before_content = std::__cxx11::string::size();
  }
  lVar9 = std::__cxx11::string::rfind((char *)rest_local,0x73137e);
  local_268 = (string *)((newline_before_content - lVar9) - 1);
  if (local_48 != (string *)0x0) {
    if (local_268 < local_48) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"Indentation indicator ",&local_289);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      std::__cxx11::to_string(local_2b0,(unsigned_long)local_48);
      std::__cxx11::string::operator+=(local_288,(string *)local_2b0);
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::string::operator+=(local_288," > leading spaces ");
      std::__cxx11::to_string(local_2d0,(unsigned_long)local_268);
      std::__cxx11::string::operator+=(local_288,(string *)local_2d0);
      std::__cxx11::string::~string((string *)local_2d0);
      std::__cxx11::string::operator+=(local_288,"\n");
      this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
      ParserFail::ParserFail(this_00,(string *)local_288);
      __cxa_throw(this_00,&ParserFail::typeinfo,ParserFail::~ParserFail);
    }
    local_268 = local_48;
  }
  std::__cxx11::string::substr((ulong)&last_newline,(ulong)rest_local);
  std::__cxx11::string::operator=((string *)psStack_38,(string *)&last_newline);
  std::__cxx11::string::~string((string *)&last_newline);
  std::__cxx11::string::operator+=((string *)psStack_38,(string *)content_local);
  while( true ) {
    psVar1 = (string *)psStack_38;
    std::__cxx11::string::size();
    num_spaces = std::__cxx11::string::find_last_of((char *)psVar1,0x73137e);
    if (num_spaces == 0xffffffffffffffff) break;
    ispace = 0;
    local_308 = num_spaces;
    while( true ) {
      local_308 = local_308 + 1;
      uVar7 = local_308;
      uVar10 = std::__cxx11::string::size();
      bVar3 = false;
      if (uVar7 < uVar10) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psStack_38);
        bVar3 = *pcVar6 == ' ';
      }
      psVar1 = (string *)psStack_38;
      if (!bVar3) break;
      ispace = ispace + 1;
    }
    if (local_268 <= ispace) break;
    local_320._M_current = (char *)std::__cxx11::string::begin();
    local_318 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator+(&local_320,num_spaces + 1);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_310,&local_318);
    local_330._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_328,&local_330);
    unindent_pos = std::__cxx11::string::erase(psVar1,local_310,local_328);
  }
  next_newline = 0;
  while (start_cut = std::__cxx11::string::find_first_of((char *)psStack_38,0x73137e),
        start_cut != 0xffffffffffffffff) {
    end_cut = start_cut + 1;
    uVar7 = start_cut;
    if (indentation_indicator._7_1_ == '>') {
      lVar9 = std::__cxx11::string::size();
      end_cut = end_cut - lVar9;
      uVar7 = start_cut;
    }
    do {
      local_358 = uVar7 + 1;
      uVar7 = local_358;
      uVar10 = std::__cxx11::string::size();
      bVar3 = false;
      if (uVar7 < uVar10) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psStack_38);
        bVar3 = *pcVar6 == ' ';
      }
      uVar7 = local_358;
    } while (bVar3);
    local_360 = local_268 + start_cut + 1;
    puVar11 = std::min<unsigned_long>((unsigned_long *)&local_360,&local_358);
    local_358 = *puVar11;
    std::__cxx11::string::substr((ulong)local_3a0,(ulong)psStack_38);
    std::__cxx11::string::substr((ulong)local_3c0,(ulong)psStack_38);
    std::operator+(local_380,local_3a0);
    std::__cxx11::string::operator=((string *)psStack_38,(string *)local_380);
    std::__cxx11::string::~string((string *)local_380);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::string::~string((string *)local_3a0);
    next_newline = end_cut;
  }
  if (indentation_indicator._6_1_ != '+') {
    remove_trailing_whitespace_and_newlines(local_3e0,psStack_38);
    std::__cxx11::string::operator=((string *)psStack_38,(string *)local_3e0);
    std::__cxx11::string::~string((string *)local_3e0);
    if (indentation_indicator._6_1_ != '-') {
      std::__cxx11::string::operator+=((string *)psStack_38,(string *)&keep_beg);
    }
  }
  psVar2 = psStack_38;
  if (indentation_indicator._7_1_ == '|') {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_400,(ulong)psVar2);
    std::__cxx11::string::operator=((string *)psStack_38,local_400);
    std::__cxx11::string::~string(local_400);
  }
  std::__cxx11::string::~string((string *)&keep_beg);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return;
}

Assistant:

void handle_block_scalar(std::size_t parent_indent_level,
      std::string const& header, std::string const& leading_empties_or_comments,
      std::string const& rest, std::string& content, std::string& comment) {
    /* read the header, resulting in: block style, chomping indicator, and
     * indentation indicator */
    char style;
    char chomping_indicator;
    std::size_t indentation_indicator = 0;
    style = header[0];
    std::stringstream ss(header.substr(1, std::string::npos));
    if (header.size() > 1 && my_isdigit(header[1])) {
      ss >> indentation_indicator;
      // indentation indicator is given as a relative number, but we need it in
      // absolute terms
      indentation_indicator += parent_indent_level;
    }
    if (!(ss >> chomping_indicator)) chomping_indicator = '\0';
    /* get information about newlines, indentation level, and comment from
       the leading_empties_or_comments string */
    std::size_t first_newline =
        leading_empties_or_comments.find_first_of("\r\n");
    std::string newline;
    if (first_newline > 0 &&
        leading_empties_or_comments[first_newline - 1] == '\r') {
      newline = "\r\n";
    } else {
      newline = "\n";
    }
    std::size_t keep_beg = first_newline + 1 - newline.size();
    if (leading_empties_or_comments[0] == '#') {
      comment = leading_empties_or_comments.substr(1, keep_beg);
    }
    // according to the YAML spec, a tab is content, not indentation
    std::size_t content_beg =
        leading_empties_or_comments.find_first_not_of("\r\n ");
    if (content_beg == std::string::npos)
      content_beg = leading_empties_or_comments.size();
    std::size_t newline_before_content =
        leading_empties_or_comments.rfind("\n", content_beg);
    std::size_t num_indent_spaces = (content_beg - newline_before_content) - 1;
    /* indentation indicator overrides the derived level of indentation, in case
       the
       user wants to keep some of that indentation as content */
    if (indentation_indicator > 0) {
      if (num_indent_spaces < indentation_indicator) {
        std::string msg = "Indentation indicator ";
        msg += std::to_string(indentation_indicator);
        msg += " > leading spaces ";
        msg += std::to_string(num_indent_spaces);
        msg += "\n";
        throw ParserFail(msg);
      }
      num_indent_spaces = indentation_indicator;
    }
    /* prepend the content from the leading_empties_or_comments to the rest */
    content = leading_empties_or_comments.substr(keep_beg, std::string::npos);
    content += rest;
    /* per Trilinos issue #2090, there can be trailing comments after the block
       scalar which are less indented than it, but they will be included in the
       final NEWLINE token.
       this code removes all contiguous trailing lines which are less indented
       than the content.
     */
    while (true) {
      auto last_newline = content.find_last_of("\n", content.size() - 2);
      if (last_newline == std::string::npos) break;
      std::size_t num_spaces = 0;
      for (auto ispace = last_newline + 1;
           ispace < content.size() && content[ispace] == ' '; ++ispace) {
        ++num_spaces;
      }
      if (num_spaces >= num_indent_spaces) break;
      content.erase(content.begin() + long(last_newline + 1), content.end());
    }
    /* remove both indentation and newlines as dictated by header information */
    std::size_t unindent_pos = 0;
    while (true) {
      std::size_t next_newline = content.find_first_of("\n", unindent_pos);
      if (next_newline == std::string::npos) break;
      std::size_t start_cut = next_newline + 1;
      /* folding block scalars remove newlines */
      if (style == '>') start_cut -= newline.size();
      std::size_t end_cut = next_newline + 1;
      /* the actual amount of indentation in the content varies, start by
         marking it all for removal */
      while (end_cut < content.size() && content[end_cut] == ' ') {
        ++end_cut;
      }
      /* but don't remove more than the actual indent number */
      end_cut = std::min(next_newline + 1 + num_indent_spaces, end_cut);
      /* cut this (newline?)+indentation out of the content */
      content = content.substr(0, start_cut) +
                content.substr(end_cut, std::string::npos);
      unindent_pos = start_cut;
    }
    if (chomping_indicator != '+') {
      content = remove_trailing_whitespace_and_newlines(content);
      if (chomping_indicator != '-') content += newline;
    }
    if (style == '|') {
      // if not already, remove the leading newline
      content = content.substr(newline.size(), std::string::npos);
    }
  }